

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

ChromeCompositorSchedulerState * __thiscall
perfetto::protos::gen::ChromeCompositorSchedulerState::operator=
          (ChromeCompositorSchedulerState *this,ChromeCompositorSchedulerState *param_1)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ChromeCompositorSchedulerAction CVar8;
  ChromeCompositorSchedulerState_BeginImplFrameDeadlineMode CVar9;
  undefined4 uVar10;
  
  protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorStateMachine>::operator=
            (&this->state_machine_,&param_1->state_machine_);
  bVar5 = param_1->begin_impl_frame_deadline_task_;
  bVar6 = param_1->pending_begin_frame_task_;
  bVar7 = param_1->skipped_last_frame_missed_exceeded_deadline_;
  CVar8 = param_1->inside_action_;
  CVar9 = param_1->deadline_mode_;
  uVar10 = *(undefined4 *)&param_1->field_0x1c;
  iVar1 = param_1->deadline_us_;
  iVar2 = param_1->deadline_scheduled_at_us_;
  iVar3 = param_1->now_us_;
  iVar4 = param_1->now_to_deadline_delta_us_;
  this->observing_begin_frame_source_ = param_1->observing_begin_frame_source_;
  this->begin_impl_frame_deadline_task_ = bVar5;
  this->pending_begin_frame_task_ = bVar6;
  this->skipped_last_frame_missed_exceeded_deadline_ = bVar7;
  this->inside_action_ = CVar8;
  this->deadline_mode_ = CVar9;
  *(undefined4 *)&this->field_0x1c = uVar10;
  this->deadline_us_ = iVar1;
  this->deadline_scheduled_at_us_ = iVar2;
  this->now_us_ = iVar3;
  this->now_to_deadline_delta_us_ = iVar4;
  this->now_to_deadline_scheduled_at_delta_us_ = param_1->now_to_deadline_scheduled_at_delta_us_;
  protozero::CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs>::operator=
            (&this->begin_impl_frame_args_,&param_1->begin_impl_frame_args_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameObserverState>::operator=
            (&this->begin_frame_observer_state_,&param_1->begin_frame_observer_state_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameSourceState>::operator=
            (&this->begin_frame_source_state_,&param_1->begin_frame_source_state_);
  protozero::CopyablePtr<perfetto::protos::gen::CompositorTimingHistory>::operator=
            (&this->compositor_timing_history_,&param_1->compositor_timing_history_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool ChromeCompositorSchedulerState::operator==(const ChromeCompositorSchedulerState& other) const {
  return unknown_fields_ == other.unknown_fields_
   && state_machine_ == other.state_machine_
   && observing_begin_frame_source_ == other.observing_begin_frame_source_
   && begin_impl_frame_deadline_task_ == other.begin_impl_frame_deadline_task_
   && pending_begin_frame_task_ == other.pending_begin_frame_task_
   && skipped_last_frame_missed_exceeded_deadline_ == other.skipped_last_frame_missed_exceeded_deadline_
   && inside_action_ == other.inside_action_
   && deadline_mode_ == other.deadline_mode_
   && deadline_us_ == other.deadline_us_
   && deadline_scheduled_at_us_ == other.deadline_scheduled_at_us_
   && now_us_ == other.now_us_
   && now_to_deadline_delta_us_ == other.now_to_deadline_delta_us_
   && now_to_deadline_scheduled_at_delta_us_ == other.now_to_deadline_scheduled_at_delta_us_
   && begin_impl_frame_args_ == other.begin_impl_frame_args_
   && begin_frame_observer_state_ == other.begin_frame_observer_state_
   && begin_frame_source_state_ == other.begin_frame_source_state_
   && compositor_timing_history_ == other.compositor_timing_history_;
}